

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O3

uint32 __thiscall Clasp::SharedContext::defaultDomPref(SharedContext *this)

{
  ulong *puVar1;
  uint32 uVar2;
  long *plVar3;
  
  plVar3 = (long *)((this->config_).ptr_ & 0xfffffffffffffffe);
  puVar1 = (ulong *)(**(code **)(*plVar3 + 0x30))(plVar3,0);
  uVar2 = 0x80000000;
  if (((*puVar1 & 0x700000000) == 0x400000000) && (0x1fffffff < (uint)puVar1[1])) {
    uVar2 = (uint)puVar1[1] >> 0x18 & 0x1f;
  }
  return uVar2;
}

Assistant:

uint32 SharedContext::defaultDomPref() const {
	const SolverParams& sp = config_->solver(0);
	return sp.heuId == Heuristic_t::Domain && sp.heuristic.domMod != HeuParams::mod_none
		? sp.heuristic.domPref
		: set_bit(0u, 31);
}